

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeFunctionType
          (Builder *this,Id returnType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes)

{
  Id IVar1;
  int iVar2;
  Id IVar3;
  Op OVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  const_reference pvVar8;
  mapped_type_conflict *pmVar9;
  Instruction *pIVar10;
  bool bVar11;
  Id debugTypeId_1;
  key_type local_78;
  int local_74;
  Id local_70;
  int p_1;
  Id typeId;
  Id local_4c;
  Id local_48;
  Id debugTypeId;
  byte local_3d;
  int p;
  key_type kStack_38;
  bool mismatch;
  int local_34;
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes_local;
  Builder *pBStack_18;
  Id returnType_local;
  Builder *this_local;
  
  local_34 = 0;
  type = (Instruction *)paramTypes;
  paramTypes_local._4_4_ = returnType;
  pBStack_18 = this;
  do {
    iVar2 = local_34;
    kStack_38 = 0x21;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&stack0xffffffffffffffc8);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar2) {
      local_70 = getUniqueId(this);
      pIVar10 = (Instruction *)::operator_new(0x60);
      spv::Instruction::Instruction(pIVar10,local_70,0,OpTypeFunction);
      pIStack_30 = pIVar10;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
      spv::Instruction::reserveOperands(pIVar10,sVar6 + 1);
      spv::Instruction::addIdOperand(pIStack_30,paramTypes_local._4_4_);
      for (local_74 = 0; iVar2 = local_74,
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type),
          pIVar10 = pIStack_30, iVar2 < (int)sVar6; local_74 = local_74 + 1) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type,
                            (long)local_74);
        spv::Instruction::addIdOperand(pIVar10,*pvVar8);
      }
      local_78 = 0x21;
      pmVar5 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,&local_78);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar5,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
                 &stack0xffffffffffffff80,pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffff80);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xffffffffffffff80);
      Module::mapInstruction(&this->module,pIStack_30);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        IVar1 = makeDebugFunctionType
                          (this,paramTypes_local._4_4_,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
        pmVar9 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_70);
        *pmVar9 = IVar1;
      }
      IVar1 = spv::Instruction::getResultId(pIStack_30);
      return IVar1;
    }
    p = 0x21;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,(key_type *)&p);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_34);
    pIStack_30 = *ppIVar7;
    IVar1 = spv::Instruction::getIdOperand(pIStack_30,0);
    if (IVar1 == paramTypes_local._4_4_) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
      iVar2 = spv::Instruction::getNumOperands(pIStack_30);
      if ((int)sVar6 == iVar2 + -1) {
        local_3d = 0;
        for (debugTypeId = 0; IVar1 = debugTypeId,
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type),
            (int)IVar1 < (int)sVar6; debugTypeId = debugTypeId + 1) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type,
                              (long)(int)debugTypeId);
          IVar1 = *pvVar8;
          IVar3 = spv::Instruction::getIdOperand(pIStack_30,debugTypeId + 1);
          if (IVar1 != IVar3) {
            local_3d = 1;
            break;
          }
        }
        if ((local_3d & 1) == 0) {
          bVar11 = false;
          if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
            local_48 = spv::Instruction::getResultId(pIStack_30);
            pmVar9 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](&this->debugId,&local_48);
            bVar11 = *pmVar9 == 0;
          }
          if (bVar11) {
            if (this->sourceLang != SourceLanguageHLSL) {
              __assert_fail("sourceLang == spv::SourceLanguageHLSL",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                            ,0x286,"Id spv::Builder::makeFunctionType(Id, const std::vector<Id> &)")
              ;
            }
            OVar4 = getTypeClass(this,paramTypes_local._4_4_);
            bVar11 = false;
            if (OVar4 == OpTypeVoid) {
              sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
              bVar11 = sVar6 == 0;
            }
            IVar1 = paramTypes_local._4_4_;
            if (!bVar11) {
              __assert_fail("getTypeClass(returnType) == OpTypeVoid && paramTypes.size() == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                            ,0x287,"Id spv::Builder::makeFunctionType(Id, const std::vector<Id> &)")
              ;
            }
            memset(&typeId,0,0x18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&typeId);
            IVar1 = makeDebugFunctionType
                              (this,IVar1,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&typeId);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&typeId);
            local_4c = IVar1;
            p_1 = spv::Instruction::getResultId(pIStack_30);
            pmVar9 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](&this->debugId,(key_type *)&p_1);
            *pmVar9 = IVar1;
          }
          IVar1 = spv::Instruction::getResultId(pIStack_30);
          return IVar1;
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const std::vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
        {
            // If compiling HLSL, glslang will create a wrapper function around the entrypoint. Accordingly, a void(void)
            // function type is created for the wrapper function. However, nonsemantic shader debug information is disabled
            // while creating the HLSL wrapper. Consequently, if we encounter another void(void) function, we need to create
            // the associated debug function type if it hasn't been created yet.
            if(emitNonSemanticShaderDebugInfo && debugId[type->getResultId()] == 0) {
                assert(sourceLang == spv::SourceLanguageHLSL);
                assert(getTypeClass(returnType) == OpTypeVoid && paramTypes.size() == 0);

                Id debugTypeId = makeDebugFunctionType(returnType, {});
                debugId[type->getResultId()] = debugTypeId;
            }
            return type->getResultId();
        }
    }

    // not found, make it
    Id typeId = getUniqueId();
    type = new Instruction(typeId, NoType, OpTypeFunction);
    type->reserveOperands(paramTypes.size() + 1);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // make debug type and map it
    if (emitNonSemanticShaderDebugInfo) {
        Id debugTypeId = makeDebugFunctionType(returnType, paramTypes);
        debugId[typeId] = debugTypeId;
    }

    return type->getResultId();
}